

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::WeightParams::ByteSizeLong(WeightParams *this)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  string *psVar4;
  long lVar5;
  size_t sVar6;
  
  uVar2 = (ulong)(uint)(this->floatvalue_).current_size_;
  if (uVar2 == 0) {
    lVar5 = 0;
  }
  else {
    uVar3 = ((long)(uVar2 << 0x22) >> 0x20) + 1;
    lVar5 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    lVar5 = (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 1;
  }
  sVar6 = lVar5 + uVar2 * 4;
  psVar4 = (string *)((ulong)(this->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar1 = google::protobuf::internal::WireFormatLite::BytesSize(psVar4);
    sVar6 = sVar6 + sVar1 + 1;
  }
  psVar4 = (string *)((ulong)(this->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar1 = google::protobuf::internal::WireFormatLite::BytesSize(psVar4);
    sVar6 = sVar6 + sVar1 + 2;
  }
  psVar4 = (string *)((ulong)(this->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar1 = google::protobuf::internal::WireFormatLite::BytesSize(psVar4);
    sVar6 = sVar6 + sVar1 + 2;
  }
  if (this->quantization_ != (QuantizationParams *)0x0 &&
      this != (WeightParams *)_WeightParams_default_instance_) {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::QuantizationParams>(this->quantization_);
    sVar6 = sVar6 + sVar1 + 2;
  }
  sVar1 = sVar6 + 3;
  if (this->isupdatable_ == false) {
    sVar1 = sVar6;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar1 = sVar1 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar1;
  return sVar1;
}

Assistant:

size_t WeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.WeightParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_floatvalue_size());
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // bytes float16Value = 2;
  if (!this->_internal_float16value().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_float16value());
  }

  // bytes rawValue = 30;
  if (!this->_internal_rawvalue().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_rawvalue());
  }

  // bytes int8RawValue = 31;
  if (!this->_internal_int8rawvalue().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_int8rawvalue());
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->_internal_has_quantization()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *quantization_);
  }

  // bool isUpdatable = 50;
  if (this->_internal_isupdatable() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}